

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtestPlatform.cpp
# Opt level: O0

long TimeInMillisImplementation(void)

{
  timezone tz;
  timeval tv;
  timezone tStack_18;
  timeval local_10;
  
  gettimeofday(&local_10,&tStack_18);
  return local_10.tv_sec * 1000 + (long)((double)local_10.tv_usec * 0.001);
}

Assistant:

static long TimeInMillisImplementation()
{
#ifdef CPPUTEST_HAVE_GETTIMEOFDAY
    struct timeval tv;
    struct timezone tz;
    gettimeofday(&tv, &tz);
    return (tv.tv_sec * 1000) + (long)((double)tv.tv_usec * 0.001);
#else
    return 0;
#endif
}